

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_xz.c
# Opt level: O1

int archive_compressor_xz_open(archive_write_filter *f)

{
  lzma_stream *strm;
  uint32_t *puVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  lzma_match_finder lVar4;
  lzma_bool lVar5;
  byte bVar6;
  uint uVar7;
  lzma_ret lVar8;
  lzma_ret extraout_EAX;
  void *pvVar9;
  long lVar10;
  byte bVar11;
  byte bVar12;
  uint uVar13;
  char *fmt;
  int error_number;
  archive *a;
  undefined8 uVar14;
  size_t __size;
  lzma_mt local_a8;
  
  puVar1 = (uint32_t *)f->data;
  if (*(long *)(puVar1 + 0x4a) == 0) {
    __size = 0x10000;
    if (f->archive->magic == 0xb0c5c0de) {
      uVar7 = archive_write_get_bytes_per_block(f->archive);
      __size = (long)(int)uVar7;
      if ((uVar7 < 0x10001) && (__size = 0x10000, uVar7 != 0)) {
        auVar3._8_8_ = 0;
        auVar3._0_8_ = (long)(int)uVar7;
        __size = 0x10000 - SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x10000)) % auVar3,0);
      }
    }
    *(size_t *)(puVar1 + 0x4c) = __size;
    pvVar9 = malloc(__size);
    *(void **)(puVar1 + 0x4a) = pvVar9;
    if (pvVar9 != (void *)0x0) goto LAB_00170259;
    a = f->archive;
    fmt = "Can\'t allocate data for compression buffer";
  }
  else {
LAB_00170259:
    f->write = archive_compressor_xz_write;
    if (f->code == 9) {
      lVar10 = (long)(int)*puVar1;
      puVar1[0x2c] = option_values[lVar10].dict_size;
      puVar1[0x2e] = 0;
      puVar1[0x2f] = 0;
      puVar1[0x30] = 0;
      puVar1[0x31] = 3;
      puVar1[0x32] = 0;
      puVar1[0x33] = 2;
      puVar1[0x34] = (2 < lVar10) + 1;
      lVar4 = option_values[lVar10].mf;
      puVar1[0x35] = option_values[lVar10].nice_len;
      puVar1[0x36] = lVar4;
      puVar1[0x37] = 0;
      uVar14 = 0x4000000000000001;
    }
    else {
      lVar5 = lzma_lzma_preset((lzma_options_lzma *)(puVar1 + 0x2c),*puVar1);
      uVar14 = 0x21;
      if (lVar5 != '\0') {
        archive_set_error(f->archive,-1,"Internal error initializing compression library");
      }
    }
    *(undefined8 *)(puVar1 + 0x24) = uVar14;
    *(uint32_t **)(puVar1 + 0x26) = puVar1 + 0x2c;
    puVar1[0x28] = 0xffffffff;
    puVar1[0x29] = 0xffffffff;
    strm = (lzma_stream *)(puVar1 + 2);
    memset(strm,0,0x88);
    *(undefined1 **)(puVar1 + 8) = *(undefined1 **)(puVar1 + 0x4a);
    *(undefined8 *)(puVar1 + 10) = *(undefined8 *)(puVar1 + 0x4c);
    if (f->code == 5) {
      lVar8 = lzma_alone_encoder(strm,(lzma_options_lzma *)(puVar1 + 0x2c));
    }
    else if (f->code == 6) {
      if (puVar1[1] == 1) {
        lVar8 = lzma_stream_encoder(strm,(lzma_filter *)(puVar1 + 0x24),LZMA_CHECK_CRC64);
      }
      else {
        local_a8.block_size = 0;
        local_a8.reserved_enum2 = LZMA_RESERVED_ENUM;
        local_a8.reserved_enum3 = LZMA_RESERVED_ENUM;
        local_a8.reserved_ptr3 = (void *)0x0;
        local_a8.reserved_ptr4 = (void *)0x0;
        local_a8.reserved_ptr1 = (void *)0x0;
        local_a8.reserved_ptr2 = (void *)0x0;
        local_a8.reserved_int7 = 0;
        local_a8.reserved_int8 = 0;
        local_a8.reserved_int5 = 0;
        local_a8.reserved_int6 = 0;
        local_a8.reserved_int1 = 0;
        local_a8.reserved_int2 = 0;
        local_a8.reserved_int3 = 0;
        local_a8.reserved_int4 = 0;
        local_a8._0_8_ = (ulong)puVar1[1] << 0x20;
        local_a8.timeout = 300;
        local_a8.preset = 0;
        local_a8.filters = (lzma_filter *)(puVar1 + 0x24);
        local_a8.check = LZMA_CHECK_CRC64;
        local_a8.reserved_enum1 = LZMA_RESERVED_ENUM;
        lVar8 = lzma_stream_encoder_mt(strm,&local_a8);
      }
    }
    else {
      uVar7 = puVar1[0x2c];
      if (uVar7 - 0x1000 < 0x1ffff001) {
        uVar13 = 0x1d;
        do {
          if ((uVar7 >> (uVar13 & 0x1f) & 1) != 0) goto LAB_001703c8;
          bVar2 = 0xc < uVar13;
          uVar13 = uVar13 - 1;
        } while (bVar2);
        uVar13 = 0xb;
LAB_001703c8:
        bVar11 = (byte)uVar13;
        bVar6 = 0;
        bVar12 = bVar11;
        if (1 << (bVar11 & 0x1f) < (int)uVar7) {
          bVar12 = bVar11 + 1;
          bVar6 = (byte)(((int)((1 << (bVar12 & 0x1f)) - uVar7) / (1 << (bVar11 - 3 & 0x1f)) & 7U)
                        << 5);
        }
        puVar1[0x50] = 0;
        **(undefined1 **)(puVar1 + 0x4a) = 0x4c;
        *(undefined1 *)(*(long *)(puVar1 + 0x4a) + 1) = 0x5a;
        *(undefined1 *)(*(long *)(puVar1 + 0x4a) + 2) = 0x49;
        *(undefined1 *)(*(long *)(puVar1 + 0x4a) + 3) = 0x50;
        *(undefined1 *)(*(long *)(puVar1 + 0x4a) + 4) = 1;
        *(byte *)(*(long *)(puVar1 + 0x4a) + 5) = bVar12 & 0x1f | bVar6;
        *(long *)(puVar1 + 8) = *(long *)(puVar1 + 8) + 6;
        *(long *)(puVar1 + 10) = *(long *)(puVar1 + 10) + -6;
        lVar8 = lzma_raw_encoder(strm,(lzma_filter *)(puVar1 + 0x24));
      }
      else {
        archive_set_error(f->archive,-1,"Unacceptable dictionary size for lzip: %d",(ulong)uVar7);
        lVar8 = extraout_EAX;
      }
      if (0x1ffff000 < uVar7 - 0x1000) {
        return -0x1e;
      }
    }
    if (lVar8 == LZMA_OK) {
      f->data = puVar1;
      return 0;
    }
    if (lVar8 != LZMA_MEM_ERROR) {
      a = f->archive;
      fmt = "Internal error initializing compression library: It\'s a bug in liblzma";
      error_number = -1;
      goto LAB_00170512;
    }
    a = f->archive;
    fmt = "Internal error initializing compression library: Cannot allocate memory";
  }
  error_number = 0xc;
LAB_00170512:
  archive_set_error(a,error_number,fmt);
  return -0x1e;
}

Assistant:

static int
archive_compressor_xz_open(struct archive_write_filter *f)
{
	struct private_data *data = f->data;
	int ret;

	if (data->compressed == NULL) {
		size_t bs = 65536, bpb;
		if (f->archive->magic == ARCHIVE_WRITE_MAGIC) {
			/* Buffer size should be a multiple number of the of bytes
			 * per block for performance. */
			bpb = archive_write_get_bytes_per_block(f->archive);
			if (bpb > bs)
				bs = bpb;
			else if (bpb != 0)
				bs -= bs % bpb;
		}
		data->compressed_buffer_size = bs;
		data->compressed
		    = (unsigned char *)malloc(data->compressed_buffer_size);
		if (data->compressed == NULL) {
			archive_set_error(f->archive, ENOMEM,
			    "Can't allocate data for compression buffer");
			return (ARCHIVE_FATAL);
		}
	}

	f->write = archive_compressor_xz_write;

	/* Initialize compression library. */
	if (f->code == ARCHIVE_FILTER_LZIP) {
		const struct option_value *val =
		    &option_values[data->compression_level];

		data->lzma_opt.dict_size = val->dict_size;
		data->lzma_opt.preset_dict = NULL;
		data->lzma_opt.preset_dict_size = 0;
		data->lzma_opt.lc = LZMA_LC_DEFAULT;
		data->lzma_opt.lp = LZMA_LP_DEFAULT;
		data->lzma_opt.pb = LZMA_PB_DEFAULT;
		data->lzma_opt.mode =
		    data->compression_level<= 2? LZMA_MODE_FAST:LZMA_MODE_NORMAL;
		data->lzma_opt.nice_len = val->nice_len;
		data->lzma_opt.mf = val->mf;
		data->lzma_opt.depth = 0;
		data->lzmafilters[0].id = LZMA_FILTER_LZMA1;
		data->lzmafilters[0].options = &data->lzma_opt;
		data->lzmafilters[1].id = LZMA_VLI_UNKNOWN;/* Terminate */
	} else {
		if (lzma_lzma_preset(&data->lzma_opt, data->compression_level)) {
			archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
			    "Internal error initializing compression library");
		}
		data->lzmafilters[0].id = LZMA_FILTER_LZMA2;
		data->lzmafilters[0].options = &data->lzma_opt;
		data->lzmafilters[1].id = LZMA_VLI_UNKNOWN;/* Terminate */
	}
	ret = archive_compressor_xz_init_stream(f, data);
	if (ret == LZMA_OK) {
		f->data = data;
		return (0);
	}
	return (ARCHIVE_FATAL);
}